

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall adios2::IO::SetEngine(IO *this,string *engineType)

{
  undefined8 uVar1;
  string *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_00000028;
  IO *in_stack_00000030;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to IO::SetEngine",&local_31);
  helper::CheckForNullptr<adios2::core::IO>(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  uVar1 = *in_RDI;
  std::__cxx11::string::string(local_68,in_RSI);
  adios2::core::IO::SetEngine(uVar1,local_68);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void IO::SetEngine(const std::string engineType)
{
    helper::CheckForNullptr(m_IO, "in call to IO::SetEngine");
    m_IO->SetEngine(engineType);
}